

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

void hash_table_free(hash_table_t *h)

{
  hash_entry_s *phVar1;
  int local_24;
  int32 i;
  hash_entry_t *e2;
  hash_entry_t *e;
  hash_table_t *h_local;
  
  if (h != (hash_table_t *)0x0) {
    for (local_24 = 0; local_24 < h->size; local_24 = local_24 + 1) {
      e2 = h->table[local_24].next;
      while (e2 != (hash_entry_t *)0x0) {
        phVar1 = e2->next;
        ckd_free(e2);
        e2 = phVar1;
      }
    }
    ckd_free(h->table);
    ckd_free(h);
  }
  return;
}

Assistant:

void
hash_table_free(hash_table_t * h)
{
    hash_entry_t *e, *e2;
    int32 i;

    if (h == NULL)
        return;

    /* Free additional entries created for key collision cases */
    for (i = 0; i < h->size; i++) {
        for (e = h->table[i].next; e; e = e2) {
            e2 = e->next;
            ckd_free((void *) e);
        }
    }

    ckd_free((void *) h->table);
    ckd_free((void *) h);
}